

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

LY_ERR ly_in_new_memory(char *str,ly_in **in)

{
  ly_in *plVar1;
  ly_in **in_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","str","ly_in_new_memory");
    str_local._4_4_ = LY_EINVAL;
  }
  else if (in == (ly_in **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_new_memory");
    str_local._4_4_ = LY_EINVAL;
  }
  else {
    plVar1 = (ly_in *)calloc(1,0x40);
    *in = plVar1;
    if (*in == (ly_in *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_in_new_memory");
      str_local._4_4_ = LY_EMEM;
    }
    else {
      (*in)->type = LY_IN_MEMORY;
      (*in)->func_start = str;
      (*in)->current = str;
      (*in)->start = str;
      (*in)->line = 1;
      str_local._4_4_ = LY_SUCCESS;
    }
  }
  return str_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_memory(const char *str, struct ly_in **in)
{
    LY_CHECK_ARG_RET(NULL, str, in, LY_EINVAL);

    *in = calloc(1, sizeof **in);
    LY_CHECK_ERR_RET(!*in, LOGMEM(NULL), LY_EMEM);

    (*in)->type = LY_IN_MEMORY;
    (*in)->start = (*in)->current = (*in)->func_start = str;
    (*in)->line = 1;

    return LY_SUCCESS;
}